

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

void __thiscall
JetHead::ServerSocket::processFileEvents
          (ServerSocket *this,int fd,short events,jh_ptr_int_t private_data)

{
  SocketListener *pSVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined6 in_register_00000012;
  long *plVar4;
  
  if ((events & 1U) != 0) {
    if ((this->super_Socket).mSockStream == true) {
      iVar3 = accept(this,fd,(sockaddr *)CONCAT62(in_register_00000012,events),
                     (socklen_t *)private_data);
      plVar4 = (long *)CONCAT44(extraout_var,iVar3);
      if (plVar4 != (long *)0x0) {
        pSVar1 = (this->super_Socket).mListener;
        if ((pSVar1 != (SocketListener *)0x0) &&
           (cVar2 = (**(code **)(*(long *)pSVar1 + 0x18))(pSVar1,this,plVar4), cVar2 != '\0')) {
          return;
        }
        (**(code **)(*plVar4 + 0x28))(plVar4);
        (**(code **)(*plVar4 + 0x10))(plVar4);
        return;
      }
    }
    else {
      pSVar1 = (this->super_Socket).mListener;
      if (pSVar1 != (SocketListener *)0x0) {
        (**(code **)(*(long *)pSVar1 + 8))(pSVar1,this);
        return;
      }
    }
  }
  return;
}

Assistant:

void ServerSocket::processFileEvents( int fd, short events, jh_ptr_int_t private_data )
{
	TRACE_BEGIN( LOG_LVL_INFO );
	if ( events & POLLIN )
	{
		if ( isSockStream() )
		{
			bool accepted = false;
			
			// Call accept to initialize the new socket
			Socket *newSock = accept();
			
			if (newSock != NULL)
			{
				// Check if the listener wishes to accept this connection
				if (mListener != NULL)
					accepted = mListener->handleAccept(this, newSock);
				
				// If the listener does not accept the new connection then
				// close and destroy it.
				if (not accepted)
				{
					newSock->close();
					delete newSock;
				}
			}
		}
		else
		{
			if ( mListener != NULL )
			{
				mListener->handleData( this );
			}
		}
	}
}